

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iopause.c
# Opt level: O0

void iopause(iopause_fd *x,uint len,taia *deadline,taia *stamp)

{
  uint uVar1;
  int iVar2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int fd;
  int nfds;
  fd_set wfds;
  fd_set rfds;
  timeval tv;
  double dStack_50;
  int i;
  double d;
  undefined1 auStack_40 [4];
  int millisecs;
  taia t;
  taia *stamp_local;
  taia *deadline_local;
  uint len_local;
  iopause_fd *x_local;
  
  t.atto = (unsigned_long)stamp;
  iVar2 = taia_less(deadline,stamp);
  if (iVar2 == 0) {
    _auStack_40 = *(uint64 *)t.atto;
    t.sec.x = *(uint64 *)(t.atto + 8);
    t.nano = *(unsigned_long *)(t.atto + 0x10);
    taia_sub((taia *)auStack_40,deadline,(taia *)auStack_40);
    dStack_50 = taia_approx((taia *)auStack_40);
    if (1000.0 < dStack_50) {
      dStack_50 = 1000.0;
    }
    d._4_4_ = (int)(dStack_50 * 1000.0 + 20.0);
  }
  else {
    d._4_4_ = 0;
  }
  for (tv.tv_usec._4_4_ = 0; tv.tv_usec._4_4_ < len; tv.tv_usec._4_4_ = tv.tv_usec._4_4_ + 1) {
    x[(int)tv.tv_usec._4_4_].revents = 0;
  }
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    wfds.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
  }
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    (&fd + (ulong)__arr_1._4_4_ * 2)[0] = 0;
    (&fd + (ulong)__arr_1._4_4_ * 2)[1] = 0;
  }
  __i = 1;
  for (tv.tv_usec._4_4_ = 0; tv.tv_usec._4_4_ < len; tv.tv_usec._4_4_ = tv.tv_usec._4_4_ + 1) {
    uVar1 = x[(int)tv.tv_usec._4_4_].fd;
    if ((-1 < (int)uVar1) && (uVar1 < 0x400)) {
      if ((int)__i <= (int)uVar1) {
        __i = uVar1 + 1;
      }
      if ((x[(int)tv.tv_usec._4_4_].events & 1U) != 0) {
        wfds.__fds_bits[(long)((int)uVar1 / 0x40) + 0xf] =
             1L << ((byte)((long)(int)uVar1 % 0x40) & 0x3f) |
             wfds.__fds_bits[(long)((int)uVar1 / 0x40) + 0xf];
      }
      if ((x[(int)tv.tv_usec._4_4_].events & 4U) != 0) {
        *(ulong *)(&fd + (long)((int)uVar1 / 0x40) * 2) =
             1L << ((byte)((long)(int)uVar1 % 0x40) & 0x3f) |
             *(ulong *)(&fd + (long)((int)uVar1 / 0x40) * 2);
      }
    }
  }
  rfds.__fds_bits[0xf] = (__fd_mask)(d._4_4_ / 1000);
  iVar2 = select(__i,(fd_set *)(wfds.__fds_bits + 0xf),(fd_set *)&fd,(fd_set *)0x0,
                 (timeval *)(rfds.__fds_bits + 0xf));
  if (0 < iVar2) {
    for (tv.tv_usec._4_4_ = 0; tv.tv_usec._4_4_ < len; tv.tv_usec._4_4_ = tv.tv_usec._4_4_ + 1) {
      uVar1 = x[(int)tv.tv_usec._4_4_].fd;
      if ((-1 < (int)uVar1) && (uVar1 < 0x400)) {
        if (((x[(int)tv.tv_usec._4_4_].events & 1U) != 0) &&
           ((wfds.__fds_bits[(long)((int)uVar1 / 0x40) + 0xf] &
            1L << ((byte)((long)(int)uVar1 % 0x40) & 0x3f)) != 0)) {
          x[(int)tv.tv_usec._4_4_].revents = x[(int)tv.tv_usec._4_4_].revents | 1;
        }
        if (((x[(int)tv.tv_usec._4_4_].events & 4U) != 0) &&
           ((*(ulong *)(&fd + (long)((int)uVar1 / 0x40) * 2) &
            1L << ((byte)((long)(int)uVar1 % 0x40) & 0x3f)) != 0)) {
          x[(int)tv.tv_usec._4_4_].revents = x[(int)tv.tv_usec._4_4_].revents | 4;
        }
      }
    }
  }
  return;
}

Assistant:

void iopause(iopause_fd *x,unsigned int len,struct taia *deadline,struct taia *stamp)
{
  struct taia t;
  int millisecs;
  double d;
  int i;

  if (taia_less(deadline,stamp))
    millisecs = 0;
  else {
    t = *stamp;
    taia_sub(&t,deadline,&t);
    d = taia_approx(&t);
    if (d > 1000.0) d = 1000.0;
    millisecs = d * 1000.0 + 20.0;
  }

  for (i = 0;i < len;++i)
    x[i].revents = 0;

#ifdef IOPAUSE_POLL

  poll(x,len,millisecs);
  /* XXX: some kernels apparently need x[0] even if len is 0 */
  /* XXX: how to handle EAGAIN? are kernels really this dumb? */
  /* XXX: how to handle EINVAL? when exactly can this happen? */

#else
{

  struct timeval tv;
  fd_set rfds;
  fd_set wfds;
  int nfds;
  int fd;

  FD_ZERO(&rfds);
  FD_ZERO(&wfds);

  nfds = 1;
  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (fd >= nfds) nfds = fd + 1;
    if (x[i].events & IOPAUSE_READ) FD_SET(fd,&rfds);
    if (x[i].events & IOPAUSE_WRITE) FD_SET(fd,&wfds);
  }

  tv.tv_sec = millisecs / 1000;
  tv.tv_usec = 1000 * (millisecs % 1000);

  if (select(nfds,&rfds,&wfds,(fd_set *) 0,&tv) <= 0)
    return;
    /* XXX: for EBADF, could seek out and destroy the bad descriptor */

  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (x[i].events & IOPAUSE_READ)
      if (FD_ISSET(fd,&rfds)) x[i].revents |= IOPAUSE_READ;
    if (x[i].events & IOPAUSE_WRITE)
      if (FD_ISSET(fd,&wfds)) x[i].revents |= IOPAUSE_WRITE;
  }

}
#endif

}